

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

bool __thiscall
ON_OffsetSurface::Evaluate
          (ON_OffsetSurface *this,double s,double t,int der_count,int v_stride,double *v,int side,
          int *hint)

{
  bool bVar1;
  double *value;
  long lVar2;
  int iVar3;
  ON_3dVector *v_00;
  int der_count_00;
  ON_3dVector N;
  ON_3dVector srf_value [6];
  ON_3dVector Nt;
  ON_3dVector Ns;
  double darray [21];
  ON_3dVector local_1b0;
  ON_3dVector local_198;
  ON_3dVector local_180;
  ON_3dVector local_168;
  ON_3dVector local_150;
  ON_3dVector local_138;
  ON_3dVector local_120;
  ON_3dVector local_108;
  ON_3dVector local_f0;
  double local_d8 [21];
  
  v_00 = &local_198;
  if (1 < der_count) {
    v_00 = (ON_3dVector *)v;
  }
  iVar3 = 3;
  if (1 < der_count) {
    iVar3 = v_stride;
  }
  der_count_00 = 2;
  if (2 < der_count) {
    der_count_00 = der_count;
  }
  bVar1 = ON_SurfaceProxy::Evaluate
                    (&this->super_ON_SurfaceProxy,s,t,der_count_00,iVar3,&v_00->x,side,hint);
  if (v_00 == (ON_3dVector *)v) {
    ON_3dVector::operator=(&local_198,v);
    ON_3dVector::operator=(&local_180,v + v_stride);
    ON_3dVector::operator=(&local_168,v + v_stride * 2);
    ON_3dVector::operator=(&local_150,v + v_stride * 3);
    ON_3dVector::operator=(&local_138,v + v_stride * 4);
    ON_3dVector::operator=(&local_120,v + v_stride * 5);
  }
  else {
    *v = local_198.x;
    v[1] = local_198.y;
    v[2] = local_198.z;
    if (0 < der_count) {
      v[v_stride] = local_180.x;
      (v + v_stride)[1] = local_180.y;
      v[(long)v_stride + 2] = local_180.z;
      v[v_stride * 2] = local_168.x;
      (v + v_stride * 2)[1] = local_168.y;
      v[(long)(v_stride * 2) + 2] = local_168.z;
    }
  }
  if (bVar1) {
    if (der_count < 6) {
      value = local_d8;
    }
    else {
      value = (double *)onmalloc((ulong)((uint)((der_count + 2) * (der_count + 1)) >> 1) << 3);
    }
    bVar1 = ON_OffsetSurfaceFunction::EvaluateDistance(&this->m_offset_function,s,t,der_count,value)
    ;
    if (bVar1) {
      ON_EvNormal(side,&local_180,&local_168,&local_150,&local_138,&local_120,&local_1b0);
      *v = *value * local_1b0.x + *v;
      v[1] = *value * local_1b0.y + v[1];
      v[2] = *value * local_1b0.z + v[2];
      if (0 < der_count) {
        ON_EvNormalPartials(&local_180,&local_168,&local_150,&local_138,&local_120,&local_f0,
                            &local_108);
        v[v_stride] = *value * local_f0.x + value[1] * local_1b0.x + v[v_stride];
        v[(long)v_stride + 1] = *value * local_f0.y + value[1] * local_1b0.y + v[(long)v_stride + 1]
        ;
        v[(long)v_stride + 2] = *value * local_f0.z + value[1] * local_1b0.z + v[(long)v_stride + 2]
        ;
        lVar2 = (long)(v_stride * 2);
        v[lVar2] = *value * local_108.x + local_1b0.x * value[2] + v[lVar2];
        iVar3 = v_stride * 2 + 1;
        v[iVar3] = *value * local_108.y + local_1b0.y * value[2] + v[iVar3];
        v[lVar2 + 2] = *value * local_108.z + local_1b0.z * value[2] + v[lVar2 + 2];
      }
    }
    if (value != local_d8) {
      onfree(value);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_OffsetSurface::Evaluate(
       double s, double t,
       int der_count,
       int v_stride,
       double* v,
       int side,
       int* hint
       ) const
{
  int vv_stride = v_stride;
  double* vv = v;
  ON_3dVector srf_value[6];//, normal_value[3];
  if ( der_count < 2 )
  {
    vv = &srf_value[0].x;
    vv_stride = 3;
  }

  bool rc = ON_SurfaceProxy::Evaluate(s,t,(der_count>2?der_count:2),vv_stride,vv,side,hint);

  if ( v != vv )
  {
    // save answer in v[] array
    v[0] = srf_value[0].x;
    v[1] = srf_value[0].y;
    v[2] = srf_value[0].z;
    if ( der_count > 0 )
    {
      v[v_stride]   = srf_value[1].x;
      v[v_stride+1] = srf_value[1].y;
      v[v_stride+2] = srf_value[1].z;
      v[2*v_stride]   = srf_value[2].x;
      v[2*v_stride+1] = srf_value[2].y;
      v[2*v_stride+2] = srf_value[2].z;
    }
  }
  else
  {
    srf_value[0] = v;
    srf_value[1] = v+v_stride;
    srf_value[2] = v+2*v_stride;
    srf_value[3] = v+3*v_stride;
    srf_value[4] = v+4*v_stride;
    srf_value[5] = v+5*v_stride;
  }

  if (rc)
  {
    double darray[21]; // 21 = ((5+1)*(5+2)/2) = enough room for der_count <= 5
    double* d = (der_count>5)
              ? (double*)onmalloc(((der_count+1)*(der_count+2))/2*sizeof(d[0]))
              : darray;
    rc = m_offset_function.EvaluateDistance(s,t,der_count,d);
    if (rc)
    {
      ON_3dVector N;
      ON_EvNormal(side,
                  srf_value[1], srf_value[2],
                  srf_value[3], srf_value[4], srf_value[5],
                  N);
      v[0] += d[0]*N.x;
      v[1] += d[0]*N.y;
      v[2] += d[0]*N.z;

      if ( der_count > 0 )
      {
        ON_3dVector Ns, Nt;
        ON_EvNormalPartials(srf_value[1], srf_value[2],
                  srf_value[3], srf_value[4], srf_value[5],
                  Ns, Nt);
        v[v_stride]   += d[0]*Ns.x + d[1]*N.x;
        v[v_stride+1] += d[0]*Ns.y + d[1]*N.y;
        v[v_stride+2] += d[0]*Ns.z + d[1]*N.z;

        v[2*v_stride]   += d[0]*Nt.x + d[2]*N.x;
        v[2*v_stride+1] += d[0]*Nt.y + d[2]*N.y;
        v[2*v_stride+2] += d[0]*Nt.z + d[2]*N.z;
      }
    }
    if ( d != darray )
      onfree(d);
  }

  return rc;
}